

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O1

spv_result_t
spvExtInstTableValueLookup
          (spv_ext_inst_table table,spv_ext_inst_type_t type,uint32_t value,
          spv_ext_inst_desc *pEntry)

{
  uint uVar1;
  spv_ext_inst_group_t *psVar2;
  bool bVar3;
  spv_result_t sVar4;
  spv_ext_inst_desc psVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  if (table == (spv_ext_inst_table)0x0) {
    sVar4 = SPV_ERROR_INVALID_TABLE;
  }
  else {
    if (pEntry == (spv_ext_inst_desc *)0x0) {
      return SPV_ERROR_INVALID_POINTER;
    }
    uVar1 = table->count;
    sVar4 = SPV_ERROR_INVALID_LOOKUP;
    if ((ulong)uVar1 != 0) {
      uVar6 = 0;
      do {
        psVar2 = table->groups;
        bVar3 = false;
        if (psVar2[uVar6].type == type) {
          uVar7 = psVar2[uVar6].count;
          bVar3 = false;
          if (uVar7 != 0) {
            psVar5 = psVar2[uVar6].entries;
            do {
              if (psVar5->ext_inst == value) {
                *pEntry = psVar5;
                bVar3 = true;
                break;
              }
              psVar5 = psVar5 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
        }
        if (bVar3) {
          return SPV_SUCCESS;
        }
        uVar6 = uVar6 + 1;
        if (uVar6 == uVar1) {
          return SPV_ERROR_INVALID_LOOKUP;
        }
      } while( true );
    }
  }
  return sVar4;
}

Assistant:

spv_result_t spvExtInstTableValueLookup(const spv_ext_inst_table table,
                                        const spv_ext_inst_type_t type,
                                        const uint32_t value,
                                        spv_ext_inst_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint32_t groupIndex = 0; groupIndex < table->count; groupIndex++) {
    const auto& group = table->groups[groupIndex];
    if (type != group.type) continue;
    for (uint32_t index = 0; index < group.count; index++) {
      const auto& entry = group.entries[index];
      if (value == entry.ext_inst) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}